

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O2

string * __thiscall
pbrt::FresnelConductor::ToString_abi_cxx11_(string *__return_storage_ptr__,FresnelConductor *this)

{
  SampledSpectrum *in_R8;
  
  StringPrintf<pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,(pbrt *)"[ FresnelConductor eta: %s k: %s ]",(char *)this,
             (SampledSpectrum *)(this + 0x10),in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string FresnelConductor::ToString() const {
    return StringPrintf("[ FresnelConductor eta: %s k: %s ]", eta, k);
}